

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::replace(CBString *this,int pos,int len,char *s,uchar cfill)

{
  uint uVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  undefined **local_f8 [2];
  void *local_e8;
  ulong local_d0;
  size_t local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  tagbstring local_40;
  
  if ((this->super_tagbstring).mlen < 1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"CBString::Write protection error","");
    CBStringException::CBStringException((CBStringException *)local_f8,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,(CBStringException *)local_f8);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if ((s == (char *)0x0) || ((len | pos) < 0)) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"CBString::Failure in replace","");
    CBStringException::CBStringException((CBStringException *)local_f8,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,(CBStringException *)local_f8);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  uVar1 = (this->super_tagbstring).slen;
  if (len + pos < (int)uVar1) {
    puVar5 = (this->super_tagbstring).data;
    if ((uint)((int)puVar5 - (int)s) < uVar1) {
      CBString((CBString *)local_f8,s);
      replace(this,pos,len,(CBString *)local_f8,cfill);
      local_f8[0] = &PTR__CBString_00184860;
      if ((uchar *)local_e8 != (uchar *)0x0) {
        free(local_e8);
      }
    }
    else {
      sVar2 = strlen(s);
      uVar6 = (ulong)len;
      if (len < 0 || uVar6 < sVar2) {
        uVar8 = ((long)(int)uVar1 - uVar6) + sVar2;
        local_d0 = uVar6;
        local_c8 = sVar2;
        if (0x7ffffffe < uVar8) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"CBString::Failure in replace, result too long.","");
          CBStringException::CBStringException((CBStringException *)local_f8,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
          CBStringException::CBStringException(pCVar3,(CBStringException *)local_f8);
          __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
        }
        alloc(this,(int)uVar8);
        puVar5 = (this->super_tagbstring).data;
        sVar2 = local_c8;
        uVar6 = local_d0;
        if (puVar5 == (uchar *)0x0) {
          return;
        }
      }
      iVar7 = (int)sVar2 - len;
      if (iVar7 != 0) {
        memmove(puVar5 + sVar2 + (long)pos,puVar5 + uVar6 + (long)pos,
                (long)(this->super_tagbstring).slen - (long)(len + pos));
        puVar5 = (this->super_tagbstring).data;
      }
      memcpy(puVar5 + pos,s,sVar2);
      lVar4 = (long)iVar7 + (long)(this->super_tagbstring).slen;
      (this->super_tagbstring).slen = (int)lVar4;
      (this->super_tagbstring).data[lVar4] = '\0';
    }
  }
  else {
    local_40.data = (uchar *)s;
    sVar2 = strlen(s);
    local_40.slen = (int)sVar2;
    local_40.mlen = -1;
    iVar7 = bsetstr(&this->super_tagbstring,pos,&local_40,cfill);
    if (iVar7 == -1) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"CBString::Failure in replace","");
      CBStringException::CBStringException((CBStringException *)local_f8,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar3,(CBStringException *)local_f8);
      __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    iVar7 = (int)((long)pos + (long)local_40.slen);
    if (iVar7 < (this->super_tagbstring).slen) {
      (this->super_tagbstring).slen = iVar7;
      (this->super_tagbstring).data[(long)pos + (long)local_40.slen] = '\0';
    }
  }
  return;
}

Assistant:

void CBString::replace (int pos, int len, const char * s, unsigned char cfill) {
struct tagbstring t;
size_t q;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s || (pos|len) < 0) {
		bstringThrow ("Failure in replace");
	} else {
		if (pos + len >= slen) {
			cstr2tbstr (t, s);
			if (BSTR_ERR == bsetstr (this, pos, &t, cfill)) {
				bstringThrow ("Failure in replace");
			} else if (pos + t.slen < slen) {
				slen = pos + t.slen;
				data[slen] = '\0';
			}
		} else {

			/* Aliasing case */
			if ((unsigned int) (data - (unsigned char *) s) < (unsigned int) slen) {
				replace (pos, len, CBString(s), cfill);
				return;
			}

			if ((q = strlen (s)) > (size_t) len || len < 0) {
				if (slen + q - len >= INT_MAX) bstringThrow ("Failure in replace, result too long.");
				alloc ((int) (slen + q - len));
				if (NULL == data) return;
			}
			if ((int) q != len) bstr__memmove (data + pos + q, data + pos + len, slen - (pos + len));
			bstr__memcpy (data + pos, s, q);
			slen += ((int) q) - len;
			data[slen] = '\0';
		}
	}
}